

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void main_loop(GPU_Target *screen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SDL_Event event;
  int local_58 [5];
  int local_44;
  
  do {
    while( true ) {
      iVar3 = SDL_PollEvent(local_58);
      if (iVar3 != 0) break;
      GPU_Clear(screen);
      GPU_Flip(screen);
    }
    bVar2 = false;
    do {
      bVar1 = true;
      if (local_58[0] != 0x100) {
        bVar1 = bVar2;
        if (local_44 == 0x1b && local_58[0] == 0x300) {
          bVar1 = true;
        }
      }
      iVar3 = SDL_PollEvent(local_58);
      bVar2 = bVar1;
    } while (iVar3 != 0);
    GPU_Clear(screen);
    GPU_Flip(screen);
  } while (!bVar1);
  return;
}

Assistant:

void main_loop(GPU_Target* screen)
{
    Uint8 done;
    SDL_Event event;
    
    done = 0;
    while(!done)
    {
        while(SDL_PollEvent(&event))
        {
            if(event.type == SDL_QUIT)
                done = 1;
            else if(event.type == SDL_KEYDOWN)
            {
                if(event.key.keysym.sym == SDLK_ESCAPE)
                    done = 1;
            }
        }
        
        // Update logic here
        
        GPU_Clear(screen);
        
        // Draw stuff here
        
        GPU_Flip(screen);
    }
}